

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_utils_leb128.c
# Opt level: O1

size_t lj_utils_read_leb128_n(int64_t *out,uint8_t *buffer,size_t n)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  int64_t value;
  ulong uVar5;
  
  uVar3 = 0;
  uVar5 = 0;
  uVar4 = 0;
  do {
    uVar1 = uVar4 + 1;
    if (n != 0 && n < uVar1) {
      return 0;
    }
    bVar2 = buffer[uVar4];
    uVar5 = uVar5 | (ulong)(bVar2 & 0x7f) << ((byte)uVar3 & 0x3f);
    uVar3 = uVar3 + 7;
    uVar4 = uVar1;
  } while ((char)bVar2 < '\0');
  uVar4 = (long)(-1 << ((byte)uVar3 & 0x1f));
  if (0x3f < uVar3) {
    uVar4 = 0;
  }
  if (bVar2 < 0x40) {
    uVar4 = 0;
  }
  *out = uVar5 | uVar4;
  return uVar1;
}

Assistant:

size_t LJ_FASTCALL lj_utils_read_leb128_n(int64_t *out, const uint8_t *buffer,
					  size_t n)
{
  return _read_leb128(out, buffer, n);
}